

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_macro.c
# Opt level: O0

uint string_to_status_code(char *status_code_string)

{
  int iVar1;
  char *in_RDI;
  uint i;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    if (2 < local_14) {
      return 0xffffffff;
    }
    iVar1 = strcmp(status_code_strings[local_14],in_RDI);
    if (iVar1 == 0) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

unsigned int string_to_status_code(const char* const status_code_string) {
    unsigned int i;
    for (i = 0; i < sizeof(status_code_strings) /
                    sizeof(status_code_strings[0]); i++) {
        if (strcmp(status_code_strings[i], status_code_string) == 0) {
            return i;
        }
    }
    return ~0U;
}